

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O1

int ixxx::posix::setenv(char *__name,char *__value,int __replace)

{
  int iVar1;
  setenv_error *this;
  int *piVar2;
  
  iVar1 = ::setenv(__name,__value,__replace);
  if (iVar1 != -1) {
    return iVar1;
  }
  this = (setenv_error *)__cxa_allocate_exception(0x20);
  piVar2 = __errno_location();
  setenv_error::sys_error(this,*piVar2,(char *)0x0,ERRNO);
  __cxa_throw(this,&setenv_error::typeinfo,ixxx::sys_error::~sys_error);
}

Assistant:

void setenv(const char *name, const char *value, bool overwrite)
    {
#if (defined(__MINGW32__) || defined(__MINGW64__))
      if (!overwrite && ::getenv(name))
        return;
      size_t a = strlen(name);
      size_t b = strlen(value);
      size_t n = a  + 1 +  b + 1;
      char *s = static_cast<char*>(ixxx::ansi::malloc(n));
      mempcpy(mempcpy(mempcpy(s, name, a), "=", 1), value, b);
      s[n-1] = 0;
      int r = ::putenv(s);
#else
      int r = ::setenv(name, value, overwrite);
#endif
      if (r == -1)
        throw setenv_error(errno);
    }